

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

void m_initthrow(monst *mtmp,int otyp,int oquan)

{
  uint uVar1;
  obj *obj;
  
  obj = mksobj(mtmp->dlevel,otyp,'\x01','\0');
  uVar1 = mt_random();
  obj->quan = SUB164(ZEXT416(uVar1) % SEXT816((long)oquan),0) + 3;
  uVar1 = weight(obj);
  obj->owt = uVar1;
  if (otyp == 3) {
    obj->field_0x4b = obj->field_0x4b | 0x80;
  }
  mpickobj(mtmp,obj);
  return;
}

Assistant:

static void m_initthrow(struct monst *mtmp, int otyp, int oquan)
{
	struct obj *otmp;

	otmp = mksobj(mtmp->dlevel, otyp, TRUE, FALSE);
	otmp->quan = (long) rn1(oquan, 3);
	otmp->owt = weight(otmp);
	if (otyp == ORCISH_ARROW) otmp->opoisoned = TRUE;
	mpickobj(mtmp, otmp);
}